

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void Rescale(CPpmd8 *p)

{
  Byte BVar1;
  byte bVar2;
  UInt16 UVar3;
  ushort uVar4;
  CPpmd_State_Ref CVar5;
  CPpmd_State *pCVar6;
  Byte BVar7;
  UInt16 UVar8;
  Byte BVar9;
  UInt16 UVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  Byte *pBVar14;
  Byte *pBVar15;
  byte bVar16;
  undefined1 uVar17;
  uint uVar18;
  CPpmd_State *oldPtr;
  CPpmd_State *pCVar19;
  CPpmd8_Context *pCVar20;
  uint uVar21;
  byte *pbVar22;
  byte bVar23;
  uint uVar24;
  CPpmd_State *pCVar25;
  uint uVar26;
  bool bVar27;
  CPpmd_State tmp;
  
  pCVar6 = p->FoundState;
  oldPtr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  UVar3 = pCVar6->SuccessorHigh;
  BVar1 = pCVar6->Symbol;
  BVar9 = pCVar6->Freq;
  UVar10 = pCVar6->SuccessorLow;
  for (; pCVar6 != oldPtr; pCVar6 = pCVar6 + -1) {
    pCVar6->SuccessorHigh = pCVar6[-1].SuccessorHigh;
    BVar7 = pCVar6[-1].Freq;
    UVar8 = pCVar6[-1].SuccessorLow;
    pCVar6->Symbol = pCVar6[-1].Symbol;
    pCVar6->Freq = BVar7;
    pCVar6->SuccessorLow = UVar8;
  }
  pCVar6->SuccessorHigh = UVar3;
  pCVar6->Symbol = BVar1;
  pCVar6->Freq = BVar9;
  pCVar6->SuccessorLow = UVar10;
  pCVar20 = p->MinContext;
  uVar4 = pCVar20->SummFreq;
  bVar16 = pCVar6->Freq;
  bVar27 = p->OrderFall != 0;
  uVar18 = (bVar16 + 4 & 0xff) + (uint)bVar27 >> 1;
  pCVar6->Freq = (Byte)uVar18;
  uVar21 = (uint)pCVar20->NumStats;
  pBVar15 = &pCVar6->Freq;
  uVar26 = (uint)uVar4 - (uint)bVar16;
  do {
    uVar11 = uVar26;
    pBVar14 = pBVar15;
    pCVar19 = pCVar6;
    bVar16 = pCVar19[1].Freq;
    uVar24 = (uint)bVar16 + (uint)bVar27 >> 1;
    bVar23 = (byte)uVar24;
    pCVar19[1].Freq = bVar23;
    if (pCVar19->Freq < uVar24) {
      BVar1 = pCVar19[1].Symbol;
      UVar3 = pCVar19[1].SuccessorLow;
      UVar10 = pCVar19[1].SuccessorHigh;
      pCVar6 = pCVar19;
      do {
        pCVar25 = pCVar6;
        pCVar25[1].SuccessorHigh = pCVar25->SuccessorHigh;
        BVar9 = pCVar25->Freq;
        UVar8 = pCVar25->SuccessorLow;
        pCVar25[1].Symbol = pCVar25->Symbol;
        pCVar25[1].Freq = BVar9;
        pCVar25[1].SuccessorLow = UVar8;
        if (pCVar25 == oldPtr) break;
        pCVar6 = pCVar25 + -1;
      } while (pCVar25[-1].Freq < bVar23);
      pCVar25->Symbol = BVar1;
      pCVar25->Freq = bVar23;
      pCVar25->SuccessorLow = UVar3;
      pCVar25->SuccessorHigh = UVar10;
    }
    uVar26 = uVar11 - bVar16;
    uVar18 = uVar18 + uVar24;
    uVar21 = uVar21 - 1;
    pCVar6 = pCVar19 + 1;
    pBVar15 = pBVar14 + 6;
    if (uVar21 == 0) {
      pCVar20 = p->MinContext;
      if (pCVar19[1].Freq == '\0') {
        bVar23 = pCVar20->NumStats;
        uVar11 = bVar16 - uVar11;
        bVar16 = bVar23;
        do {
          uVar11 = uVar11 - 1;
          bVar16 = bVar16 - 1;
          BVar1 = *pBVar14;
          pBVar14 = pBVar14 + -6;
        } while (BVar1 == '\0');
        uVar26 = -uVar11;
        pCVar20->NumStats = bVar16;
        if (bVar16 == 0) {
          bVar16 = oldPtr->Symbol;
          CVar5 = *(CPpmd_State_Ref *)&oldPtr->SuccessorLow;
          uVar12 = (ulong)(~uVar11 + (uint)oldPtr->Freq * 2) / (ulong)uVar26;
          uVar17 = 0x29;
          if (((uint)uVar12 & 0xfe) < 0x2a) {
            uVar17 = (undefined1)uVar12;
          }
          bVar23 = p->Units2Indx[(bVar23 + 2 >> 1) - 1];
          oldPtr->Symbol = 0xff;
          oldPtr->Freq = 0xff;
          oldPtr->SuccessorLow = 0xffff;
          *(CPpmd_Void_Ref *)&oldPtr->SuccessorHigh = p->FreeList[bVar23];
          bVar2 = p->Indx2Units[bVar23];
          oldPtr[1].SuccessorLow = (short)(uint)bVar2;
          oldPtr[1].SuccessorHigh = (short)((uint)bVar2 >> 0x10);
          p->FreeList[bVar23] = (int)oldPtr - *(int *)&p->Base;
          p->Stamps[bVar23] = p->Stamps[bVar23] + 1;
          pCVar20->Flags = (0x3f < bVar16) << 3 | pCVar20->Flags & 0x10;
          p->FoundState = (CPpmd_State *)&pCVar20->SummFreq;
          *(byte *)&pCVar20->SummFreq = bVar16;
          *(undefined1 *)((long)&pCVar20->SummFreq + 1) = uVar17;
          pCVar20->Stats = CVar5;
          return;
        }
        uVar11 = bVar23 + 2 >> 1;
        uVar21 = bVar16 + 2 >> 1;
        if (uVar11 == uVar21) {
          pBVar15 = p->Base;
          uVar21 = pCVar20->Stats;
        }
        else {
          pvVar13 = ShrinkUnits(p,oldPtr,uVar11,uVar21);
          pCVar20 = p->MinContext;
          pBVar15 = p->Base;
          uVar21 = (int)pvVar13 - (int)pBVar15;
          pCVar20->Stats = uVar21;
          bVar16 = pCVar20->NumStats;
        }
        uVar11 = (uint)bVar16;
        uVar12 = (ulong)uVar21;
        pbVar22 = pBVar15 + uVar12;
        bVar16 = (0x3f < *pbVar22) << 3 | pCVar20->Flags & 0xf7;
        do {
          pbVar22 = pbVar22 + 6;
          bVar16 = bVar16 | (0x3f < *pbVar22) << 3;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        pCVar20->Flags = bVar16;
      }
      else {
        bVar16 = pCVar20->Flags;
        pBVar15 = p->Base;
        uVar12 = (ulong)pCVar20->Stats;
      }
      pCVar20->SummFreq = ((short)uVar18 + (short)uVar26) - (short)(uVar26 >> 1);
      pCVar20->Flags = bVar16 | 4;
      p->FoundState = (CPpmd_State *)(pBVar15 + uVar12);
      return;
    }
  } while( true );
}

Assistant:

static void Rescale(CPpmd7 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0);
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats - 1;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (UInt16)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 1)
    {
      CPpmd_State tmp = *stats;
      do
      {
        tmp.Freq = (Byte)(tmp.Freq - (tmp.Freq >> 1));
        escFreq >>= 1;
      }
      while (escFreq > 1);
      InsertNode(p, stats, U2I(((numStats + 1) >> 1)));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 1) >> 1;
    n1 = (p->MinContext->NumStats + 1) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->FoundState = STATS(p->MinContext);
}